

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O2

void __thiscall Clasp::PBBuilder::PBBuilder(PBBuilder *this)

{
  ProductIndex *x;
  
  (this->super_ProgramBuilder).ctx_ = (SharedContext *)0x0;
  (this->super_ProgramBuilder).parser_.ptr_ = 0;
  (this->super_ProgramBuilder).frozen_ = true;
  (this->super_ProgramBuilder)._vptr_ProgramBuilder = (_func_int **)&PTR__PBBuilder_001e9650;
  (this->products_).ptr_ = 0;
  (this->prod_).lits.ebo_.buf = (pointer)0x0;
  (this->prod_).lits.ebo_.size = 0;
  (this->prod_).lits.ebo_.cap = 0;
  (this->assume_).ebo_.buf = (pointer)0x0;
  (this->assume_).ebo_.size = 0;
  (this->assume_).ebo_.cap = 0;
  this->auxVar_ = 1;
  x = (ProductIndex *)operator_new(0x58);
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_buckets = (__buckets_ptr)0x0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_bucket_count = 0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h.
  super__Hashtable_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .super__Hashtable_ebo_helper<0,_Clasp::PBBuilder::PKey,_false>._M_tp.lits.ebo_.buf = (pointer)0x0;
  *(undefined8 *)
   ((long)&(x->
           super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
           )._M_h.
           super__Hashtable_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           .super__Hashtable_ebo_helper<0,_Clasp::PBBuilder::PKey,_false>._M_tp.lits.ebo_ + 8) = 0;
  *(undefined8 *)
   &(x->
    super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
    )._M_h.
    super__Hashtable_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    .
    super__Hash_code_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
    .super__Hashtable_ebo_helper<1,_Clasp::PBBuilder::PKey,_false>._M_tp.lits = 0;
  *(undefined8 *)
   ((long)&(x->
           super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
           )._M_h.
           super__Hashtable_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           .
           super__Hash_code_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           .super__Hashtable_ebo_helper<1,_Clasp::PBBuilder::PKey,_false>._M_tp.lits + 8) = 0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_element_count = 0;
  *(undefined8 *)
   &(x->
    super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
    )._M_h._M_rehash_policy = 0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_buckets =
       &(x->
        super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
        )._M_h._M_single_bucket;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_bucket_count = 1;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_rehash_policy._M_next_resize = 0;
  (x->
  super_unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
  )._M_h._M_single_bucket = (__node_base_ptr)0x0;
  SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject>::reset(&this->products_,x);
  return;
}

Assistant:

PBBuilder::PBBuilder() : auxVar_(1) {
	products_ = new ProductIndex();
}